

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_filter.c
# Opt level: O1

void applyCoeffs(gdImagePtr src,gdImagePtr dst,double *coeffs,int radius,gdAxis axis)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  int **ppiVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  uint *puVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  
  iVar2 = src->red[(ulong)(axis == HORIZONTAL) - 3];
  if (0 < (long)iVar2) {
    uVar3 = src->red[(ulong)(axis != HORIZONTAL) - 3];
    lVar12 = (long)-radius;
    uVar18 = 0;
    do {
      if (0 < (int)uVar3) {
        ppiVar4 = dst->tpixels;
        uVar6 = 0;
        lVar8 = lVar12;
        iVar10 = radius + uVar3 * 2;
        do {
          iVar10 = iVar10 + -1;
          uVar7 = uVar18;
          uVar5 = uVar6;
          if (axis == HORIZONTAL) {
            uVar7 = uVar6;
            uVar5 = uVar18;
          }
          if (radius < 0) {
            dVar23 = 0.0;
            dVar20 = 0.0;
            dVar21 = 0.0;
            dVar22 = 0.0;
          }
          else {
            dVar22 = 0.0;
            lVar19 = 0;
            dVar21 = 0.0;
            dVar20 = 0.0;
            dVar23 = 0.0;
            lVar9 = lVar12;
            iVar11 = iVar10;
            do {
              iVar13 = (int)uVar6 + (int)lVar9;
              if (lVar8 + lVar19 < 0) {
                iVar13 = -iVar13;
              }
              else if ((long)(ulong)uVar3 <= lVar8 + lVar19) {
                iVar13 = iVar11;
              }
              if (axis == HORIZONTAL) {
                puVar15 = (uint *)(src->tpixels[uVar18] + iVar13);
              }
              else {
                puVar15 = (uint *)(src->tpixels[iVar13] + uVar18);
              }
              dVar1 = coeffs[(long)radius + lVar12 + lVar19];
              uVar16 = *puVar15;
              dVar22 = dVar22 + (double)(uVar16 >> 0x10 & 0xff) * dVar1;
              dVar21 = dVar21 + (double)(uVar16 >> 8 & 0xff) * dVar1;
              dVar20 = dVar20 + (double)(uVar16 & 0xff) * dVar1;
              dVar23 = dVar23 + (double)(uVar16 >> 0x18 & 0x7f) * dVar1;
              lVar9 = lVar9 + 1;
              lVar19 = lVar19 + 1;
              iVar11 = iVar11 + -1;
            } while (radius * 2 + 1 != (int)lVar19);
          }
          iVar11 = 0x7f;
          if (dVar23 < 0.0) {
            iVar11 = 0;
          }
          if ((ushort)(int)(dVar23 + 0.5) < 0x80) {
            iVar11 = (int)(dVar23 + 0.5);
          }
          uVar16 = 0xff;
          if (dVar22 < 0.0) {
            uVar16 = 0;
          }
          if (((int)(dVar22 + 0.5) & 0xffffU) < 0x100) {
            uVar16 = (int)(dVar22 + 0.5);
          }
          uVar14 = 0xff;
          if (dVar21 < 0.0) {
            uVar14 = 0;
          }
          if (((int)(dVar21 + 0.5) & 0xffffU) < 0x100) {
            uVar14 = (int)(dVar21 + 0.5);
          }
          uVar17 = 0xff;
          if (dVar20 < 0.0) {
            uVar17 = 0;
          }
          if (((int)(dVar20 + 0.5) & 0xffffU) < 0x100) {
            uVar17 = (int)(dVar20 + 0.5);
          }
          ppiVar4[uVar5][uVar7] =
               uVar17 & 0xff | (uVar14 & 0xff) << 8 | (uVar16 & 0xff) << 0x10 | iVar11 << 0x18;
          uVar6 = uVar6 + 1;
          lVar8 = lVar8 + 1;
        } while (uVar6 != uVar3);
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != (long)iVar2);
  }
  return;
}

Assistant:

static void
applyCoeffs(gdImagePtr src, gdImagePtr dst, double *coeffs, int radius, 
            gdAxis axis)
{
    int line, numlines, linelen;

    if (axis == HORIZONTAL) {
        numlines = src->sy;
        linelen = src->sx;
    } else {
        numlines = src->sx;
        linelen = src->sy;
    }/* if .. else*/

    for (line = 0; line < numlines; line++) {
        applyCoeffsLine(src, dst, line, linelen, coeffs, radius, axis);
    }/* for */
}